

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O1

void __thiscall
Dashel::DashelException::DashelException
          (DashelException *this,Source s,int se,char *reason,Stream *stream)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  long *plVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  undefined8 uVar6;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  Stream *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_98 = stream;
  sourceToString_abi_cxx11_(&local_50,(DashelException *)CONCAT44(in_register_00000034,s),se);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar3 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar3) {
    local_c8 = *puVar3;
    lStack_c0 = plVar1[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar3;
    local_d8 = (ulong *)*plVar1;
  }
  local_d0 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  _to_string_abi_cxx11_(&local_b8,(Dashel *)(ulong)(uint)se,(int)local_d0);
  uVar5 = 0xf;
  if (local_d8 != &local_c8) {
    uVar5 = local_c8;
  }
  if (uVar5 < local_b8._M_string_length + local_d0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar6 = local_b8.field_2._M_allocated_capacity;
    }
    if (local_b8._M_string_length + local_d0 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
      goto LAB_00117ca5;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
LAB_00117ca5:
  local_f8 = &local_e8;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_e8 = *plVar1;
    uStack_e0 = puVar2[3];
  }
  else {
    local_e8 = *plVar1;
    local_f8 = (long *)*puVar2;
  }
  local_f0 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_00122ad8;
  this->source = s;
  this->sysError = se;
  this->stream = local_98;
  return;
}

Assistant:

DashelException::DashelException(Source s, int se, const char* reason, Stream* stream) :
		std::runtime_error(sourceToString(s) + " (" + _to_string(se) + "): " + reason),
		source(s),
		sysError(se),
		stream(stream)
	{
	}